

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCall
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this,string *id)

{
  DeferCommands *pDVar1;
  pointer pDVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  __type _Var5;
  cmListFileArgument *arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer __lhs;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pDVar1 = (this->Defer)._M_t.
           super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
           .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (pDVar1 == (DeferCommands *)0x0) {
    return __return_storage_ptr__;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  __lhs = *(pointer *)
           &(pDVar1->Commands).
            super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>;
  pDVar2 = *(pointer *)
            ((long)&(pDVar1->Commands).
                    super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
            + 8);
  while( true ) {
    if (__lhs == pDVar2) goto LAB_001f1371;
    _Var5 = std::operator==(&__lhs->Id,id);
    if (_Var5) break;
    __lhs = __lhs + 1;
  }
  std::__cxx11::string::_M_assign((string *)&local_d0);
  lVar3 = *(long *)&(__lhs->Command).Impl.
                    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
  ;
  pbVar4 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar3 + 0x58);
  for (args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar3 + 0x50);
      args != pbVar4;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args[1].field_2)
  {
    local_80.View_._M_len = local_d0._M_string_length;
    local_80.View_._M_str = local_d0._M_dataplus._M_p;
    local_b0.View_._M_len = 1;
    local_b0.View_._M_str = local_b0.Digits_;
    local_b0.Digits_[0] = ';';
    cmStrCat<std::__cxx11::string>(&local_50,&local_80,&local_b0,args);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
LAB_001f1371:
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCall(std::string const& id) const
{
  cm::optional<std::string> call;
  if (this->Defer) {
    std::string tmp;
    for (DeferCommand const& dc : this->Defer->Commands) {
      if (dc.Id == id) {
        tmp = dc.Command.OriginalName();
        for (cmListFileArgument const& arg : dc.Command.Arguments()) {
          tmp = cmStrCat(tmp, ';', arg.Value);
        }
        break;
      }
    }
    call = std::move(tmp);
  }
  return call;
}